

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O2

uint32_t MicroOAAT(char *key,int len,uint32_t seed)

{
  uint uVar1;
  byte *pbVar2;
  uint uVar3;
  int iVar4;
  
  uVar1 = seed >> 0x11 | seed << 0xf;
  uVar3 = seed ^ 0x3b00;
  pbVar2 = (byte *)(key + len);
  for (; key < pbVar2; key = (char *)((byte *)key + 1)) {
    iVar4 = uVar3 + (byte)*key;
    uVar1 = uVar1 + iVar4 * -9;
    uVar3 = (uint)(iVar4 * 9) >> 0x19 | iVar4 * 0x480;
  }
  return uVar1 ^ uVar3;
}

Assistant:

uint32_t
MicroOAAT(const char *key, int len, uint32_t seed) {
#define grol(x,n) (((x)<<(n))|((x)>>(32-(n))))
#define gror(x,n) (((x)>>(n))|((x)<<(32-(n))))
  unsigned char  *str = (unsigned char *)key;
  const unsigned char *const end = (const unsigned char *)str + len;
  uint32_t h1 = seed ^ 0x3b00;
  uint32_t h2 = grol(seed, 15);
  while (str < end) {
    h1 += *str++;
    h1 += h1 << 3; // h1 *= 9
    h2 -= h1;
    // unfortunately, clang produces bad code here,
    // cause it doesn't generate rotl instruction.
    h1 = grol(h1, 7);
  }
  return h1 ^ h2;
#undef grol
#undef gror
}